

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-util.c
# Opt level: O0

_Bool borg_cave_floor_bold(int y,int X)

{
  chunk_conflict *c;
  _Bool _Var1;
  loc_conflict grid;
  int X_local;
  int y_local;
  
  c = cave;
  grid = (loc_conflict)loc(X,y);
  _Var1 = square_in_bounds_fully((chunk *)c,grid);
  if ((_Var1) &&
     ((((borg_grids[y][X].feat == '\x01' || ((borg_grids[y][X].trap & 1U) != 0)) ||
       (borg_grids[y][X].feat == '\x05')) ||
      (((borg_grids[y][X].feat == '\x06' || (borg_grids[y][X].feat == '\x04')) ||
       (borg_grids[y][X].feat == '\x03')))))) {
    X_local._3_1_ = true;
  }
  else {
    X_local._3_1_ = false;
  }
  return X_local._3_1_;
}

Assistant:

bool borg_cave_floor_bold(int y, int X)
{
    if (square_in_bounds_fully(cave, loc(X, y))) {
        if ((borg_grids[y][X].feat == FEAT_FLOOR) || (borg_grids[y][X].trap)
            || (borg_grids[y][X].feat == FEAT_LESS)
            || (borg_grids[y][X].feat == FEAT_MORE)
            || (borg_grids[y][X].feat == FEAT_BROKEN)
            || (borg_grids[y][X].feat == FEAT_OPEN))
            return true;
    }
    return false;
}